

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

double __thiscall
Fl_Text_Display::string_width(Fl_Text_Display *this,char *string,int length,int style)

{
  int iVar1;
  int iVar2;
  Fl_Font *pFVar3;
  uint uVar4;
  Fl_Fontsize *pFVar5;
  double extraout_XMM0_Qa;
  
  iVar2 = this->mNStyles;
  if (iVar2 != 0) {
    uVar4 = style & 0xff;
    if (uVar4 != 0) {
      iVar1 = iVar2 + -1;
      if ((int)(uVar4 - 0x41) < iVar2) {
        iVar1 = uVar4 - 0x41;
      }
      iVar2 = 0;
      if (0x40 < uVar4) {
        iVar2 = iVar1;
      }
      pFVar3 = &this->mStyleTable[iVar2].font;
      pFVar5 = &this->mStyleTable[iVar2].size;
      goto LAB_001d48f7;
    }
  }
  pFVar3 = &this->textfont_;
  pFVar5 = &this->textsize_;
LAB_001d48f7:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)*pFVar3,(ulong)(uint)*pFVar5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
            (fl_graphics_driver,string,(ulong)(uint)length);
  return extraout_XMM0_Qa;
}

Assistant:

double Fl_Text_Display::string_width( const char *string, int length, int style ) const {
  IS_UTF8_ALIGNED(string)

  Fl_Font font;
  Fl_Fontsize fsize;

  if ( mNStyles && (style & STYLE_LOOKUP_MASK) ) {
    int si = (style & STYLE_LOOKUP_MASK) - 'A';
    if (si < 0) si = 0;
    else if (si >= mNStyles) si = mNStyles - 1;

    font  = mStyleTable[si].font;
    fsize = mStyleTable[si].size;
  } else {
    font  = textfont();
    fsize = textsize();
  }
  fl_font( font, fsize );
  return fl_width( string, length );
}